

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlSetTreeDoc(xmlNodePtr tree,xmlDocPtr doc)

{
  xmlChar *pxVar1;
  xmlDictPtr local_50;
  xmlDictPtr local_48;
  xmlDictPtr local_40;
  xmlDictPtr oldPropDict;
  xmlDictPtr newDict;
  xmlDictPtr oldTreeDict;
  xmlAttrPtr prop;
  xmlDocPtr doc_local;
  xmlNodePtr tree_local;
  
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) && (tree->doc != doc)) {
    if (tree->doc == (_xmlDoc *)0x0) {
      local_40 = (xmlDictPtr)0x0;
    }
    else {
      local_40 = tree->doc->dict;
    }
    if (doc == (xmlDocPtr)0x0) {
      local_48 = (xmlDictPtr)0x0;
    }
    else {
      local_48 = doc->dict;
    }
    if (tree->type == XML_ELEMENT_NODE) {
      for (oldTreeDict = (xmlDictPtr)tree->properties; oldTreeDict != (xmlDictPtr)0x0;
          oldTreeDict = *(xmlDictPtr *)&oldTreeDict->seed) {
        if ((int)oldTreeDict[1].size == 2) {
          xmlRemoveID(tree->doc,(xmlAttrPtr)oldTreeDict);
        }
        if (*(xmlDocPtr *)(oldTreeDict + 1) != doc) {
          if (*(long *)(oldTreeDict + 1) == 0) {
            local_50 = (xmlDictPtr)0x0;
          }
          else {
            local_50 = *(xmlDictPtr *)(*(long *)(oldTreeDict + 1) + 0x98);
          }
          pxVar1 = _copyStringForNewDictIfNeeded(local_50,local_48,(xmlChar *)oldTreeDict->size);
          oldTreeDict->size = (size_t)pxVar1;
          *(xmlDocPtr *)(oldTreeDict + 1) = doc;
        }
        xmlSetListDoc(*(xmlNodePtr *)&oldTreeDict->nbElems,doc);
      }
    }
    if (tree->type == XML_ENTITY_REF_NODE) {
      tree->children = (_xmlNode *)0x0;
    }
    else if (tree->children != (_xmlNode *)0x0) {
      xmlSetListDoc(tree->children,doc);
    }
    pxVar1 = _copyStringForNewDictIfNeeded(local_40,local_48,tree->name);
    tree->name = pxVar1;
    pxVar1 = _copyStringForNewDictIfNeeded(local_40,(xmlDictPtr)0x0,tree->content);
    tree->content = pxVar1;
    tree->doc = doc;
  }
  return;
}

Assistant:

void
xmlSetTreeDoc(xmlNodePtr tree, xmlDocPtr doc) {
    xmlAttrPtr prop;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return;
    if (tree->doc != doc) {
        xmlDictPtr oldTreeDict = tree->doc ? tree->doc->dict : NULL;
        xmlDictPtr newDict = doc ? doc->dict : NULL;

	if(tree->type == XML_ELEMENT_NODE) {
	    prop = tree->properties;
	    while (prop != NULL) {
                if (prop->atype == XML_ATTRIBUTE_ID) {
                    xmlRemoveID(tree->doc, prop);
                }

                if (prop->doc != doc) {
                    xmlDictPtr oldPropDict = prop->doc ? prop->doc->dict : NULL;
                    prop->name = _copyStringForNewDictIfNeeded(oldPropDict, newDict, prop->name);
                    prop->doc = doc;
                }
		xmlSetListDoc(prop->children, doc);

                /*
                 * TODO: ID attributes should be also added to the new
                 * document, but this breaks things like xmlReplaceNode.
                 * The underlying problem is that xmlRemoveID is only called
                 * if a node is destroyed, not if it's unlinked.
                 */
#if 0
                if (xmlIsID(doc, tree, prop)) {
                    xmlChar *idVal = xmlNodeListGetString(doc, prop->children,
                                                          1);
                    xmlAddID(NULL, doc, idVal, prop);
                }
#endif

		prop = prop->next;
	    }
	}
        if (tree->type == XML_ENTITY_REF_NODE) {
            /*
             * Clear 'children' which points to the entity declaration
             * from the original document.
             */
            tree->children = NULL;
        } else if (tree->children != NULL) {
	    xmlSetListDoc(tree->children, doc);
        }

        tree->name = _copyStringForNewDictIfNeeded(oldTreeDict, newDict, tree->name);
        tree->content = (xmlChar *)_copyStringForNewDictIfNeeded(oldTreeDict, NULL, tree->content);
        /* FIXME: tree->ns should be updated as in xmlStaticCopyNode(). */
	tree->doc = doc;
    }
}